

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O2

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ComputeCompleteInformationValues
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  size_type __new_size;
  pointer pdVar1;
  ulong uVar2;
  ostream *poVar3;
  uint jtI;
  Index ja;
  ulong uVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  allocator<char> local_59;
  double local_58;
  string local_50;
  undefined1 extraout_var [56];
  
  this_00 = &this->_m_completeInformationValues;
  __new_size = BayesianGameBase::GetNrJointTypes();
  std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
  pdVar1 = (this->_m_completeInformationValues).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (jtI = 0; (long)(this->_m_completeInformationValues).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar1 >> 3 != (ulong)jtI;
      jtI = jtI + 1) {
    if (jtI % 100 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"BnB deadline exceeded (in ComputeCompleteInformationValues())"
                 ,&local_59);
      (**(code **)(*(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                             super_BGIP_IncrementalSolverInterface + 8))(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    uVar4 = 0;
    local_58 = -1.79769313486232e+308;
    while( true ) {
      uVar2 = BayesianGameBase::GetNrJointActions();
      if (uVar2 == uVar4) break;
      auVar5._0_8_ = GetContribution(this,jtI,(Index)uVar4);
      auVar5._8_56_ = extraout_var;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_58;
      uVar4 = (ulong)((Index)uVar4 + 1);
      auVar6 = vmaxsd_avx(auVar6,auVar5._0_16_);
      local_58 = auVar6._0_8_;
    }
    pdVar1 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1[jtI] = local_58;
  }
  if (2 < this->_m_verbosity) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "BGIP_SolverBranchAndBound Complete information values: ");
    PrintTools::SoftPrintVector<double>(&local_50,this_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void ComputeCompleteInformationValues()
    {
        _m_completeInformationValues.resize(_m_bgip->GetNrJointTypes());
        for(Index i=0;i!=_m_completeInformationValues.size();++i)
        {
            if(i % 100 == 0)
                this->CheckDeadline("BnB deadline exceeded (in ComputeCompleteInformationValues())");

            double bestValue=-DBL_MAX;
            for(Index ja=0;ja!=_m_bgip->GetNrJointActions();++ja)
            {
                double c=GetContribution(i,ja);
                bestValue=std::max(c,bestValue);
            }
            _m_completeInformationValues[i]=bestValue;
        }
        
        if(_m_verbosity>2)
            std::cout << "BGIP_SolverBranchAndBound Complete information values: "
                      << SoftPrintVector(_m_completeInformationValues)
                      << std::endl;
    }